

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O1

void __thiscall HMatrix::update(HMatrix *this,int columnIn,int columnOut)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer piVar9;
  pointer pdVar10;
  long lVar11;
  int __tmp;
  long lVar12;
  long lVar13;
  long lVar14;
  
  if (columnIn < this->numCol) {
    piVar5 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = (long)piVar5[columnIn];
    if (piVar5[columnIn] < piVar5[(long)columnIn + 1]) {
      piVar6 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = (this->AR_Nend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar9 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar2 = piVar6[lVar12];
        iVar3 = piVar7[iVar2];
        iVar4 = piVar8[iVar2];
        piVar8[iVar2] = iVar4 + -1;
        lVar14 = (long)iVar3 << 2;
        do {
          lVar13 = lVar14;
          iVar2 = *(int *)((long)piVar9 + lVar13);
          lVar14 = lVar13 + 4;
        } while (iVar2 != columnIn);
        *(int *)((long)piVar9 + lVar13) = piVar9[(long)iVar4 + -1];
        piVar9[(long)iVar4 + -1] = iVar2;
        dVar1 = *(double *)((long)pdVar10 + lVar14 * 2 + -8);
        *(double *)((long)pdVar10 + lVar14 * 2 + -8) = pdVar10[(long)iVar4 + -1];
        pdVar10[(long)iVar4 + -1] = dVar1;
        lVar12 = lVar12 + 1;
      } while (lVar12 < piVar5[(long)columnIn + 1]);
    }
  }
  if (columnOut < this->numCol) {
    piVar5 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = (long)piVar5[columnOut];
    if (piVar5[columnOut] < piVar5[(long)columnOut + 1]) {
      piVar6 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->AR_Nend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar2 = piVar6[lVar12];
        iVar3 = piVar7[iVar2];
        lVar13 = (long)iVar3;
        piVar7[iVar2] = iVar3 + 1;
        lVar14 = lVar13 * 4;
        do {
          lVar11 = lVar14;
          iVar2 = *(int *)((long)piVar8 + lVar11);
          lVar14 = lVar11 + 4;
        } while (iVar2 != columnOut);
        *(int *)((long)piVar8 + lVar11) = piVar8[lVar13];
        piVar8[lVar13] = iVar2;
        dVar1 = *(double *)((long)pdVar10 + lVar14 * 2 + -8);
        *(double *)((long)pdVar10 + lVar14 * 2 + -8) = pdVar10[lVar13];
        pdVar10[lVar13] = dVar1;
        lVar12 = lVar12 + 1;
      } while (lVar12 < piVar5[(long)columnOut + 1]);
    }
  }
  return;
}

Assistant:

void HMatrix::update(int columnIn, int columnOut) {
    if (columnIn < numCol) {
        for (int k = Astart[columnIn]; k < Astart[columnIn + 1]; k++) {
            int iRow = Aindex[k];
            int iFind = ARstart[iRow];
            int iSwap = --AR_Nend[iRow];
            while (ARindex[iFind] != columnIn)
                iFind++;
            swap(ARindex[iFind], ARindex[iSwap]);
            swap(ARvalue[iFind], ARvalue[iSwap]);
        }
    }

    if (columnOut < numCol) {
        for (int k = Astart[columnOut]; k < Astart[columnOut + 1]; k++) {
            int iRow = Aindex[k];
            int iFind = AR_Nend[iRow];
            int iSwap = AR_Nend[iRow]++;
            while (ARindex[iFind] != columnOut)
                iFind++;
            swap(ARindex[iFind], ARindex[iSwap]);
            swap(ARvalue[iFind], ARvalue[iSwap]);
        }
    }
	//rp_mtx();
}